

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileIO.cpp
# Opt level: O2

string * read_text_file(string *__return_storage_ptr__,string *path)

{
  stringstream ss;
  ostream local_388 [376];
  ifstream file;
  streambuf local_200 [504];
  
  std::ifstream::ifstream(&file,(string *)path,_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::ostream::operator<<(local_388,local_200);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::ifstream::~ifstream(&file);
  return __return_storage_ptr__;
}

Assistant:

std::string read_text_file(const std::string& path) {
  std::ifstream file(path);
  std::stringstream ss;
  ss << file.rdbuf();
  return ss.str();
}